

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

size_t anon_unknown.dwarf_2dc1b7::cmWriteToMemoryCallback
                 (void *ptr,size_t size,size_t nmemb,void *data)

{
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_50;
  const_iterator local_48;
  char *local_40;
  char *chPtr;
  cmFileCommandVectorOfChar *vec;
  void *pvStack_28;
  int realsize;
  void *data_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  vec._4_4_ = (int)size * (int)nmemb;
  local_40 = (char *)ptr;
  chPtr = (char *)data;
  pvStack_28 = data;
  data_local = (void *)nmemb;
  nmemb_local = size;
  size_local = (size_t)ptr;
  local_50._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)data);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_48,
             &local_50);
  std::vector<char,std::allocator<char>>::insert<char_const*,void>
            ((vector<char,std::allocator<char>> *)data,local_48,local_40,local_40 + vec._4_4_);
  return (long)vec._4_4_;
}

Assistant:

size_t
  cmWriteToMemoryCallback(void *ptr, size_t size, size_t nmemb,
                          void *data)
    {
    int realsize = (int)(size * nmemb);
    cmFileCommandVectorOfChar *vec
      = static_cast<cmFileCommandVectorOfChar*>(data);
    const char* chPtr = static_cast<char*>(ptr);
    vec->insert(vec->end(), chPtr, chPtr + realsize);
    return realsize;
    }